

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult __thiscall
testing::internal::CmpHelperEQ<std::tuple<int,int>,std::tuple<int,int>>
          (internal *this,char *expected_expression,char *actual_expression,
          tuple<int,_int> *expected,tuple<int,_int> *actual)

{
  AssertionResult AVar2;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  
  if (((expected->super__Tuple_impl<0UL,_int,_int>).super__Head_base<0UL,_int,_false>._M_head_impl
       == (actual->super__Tuple_impl<0UL,_int,_int>).super__Head_base<0UL,_int,_false>._M_head_impl)
     && ((expected->super__Tuple_impl<0UL,_int,_int>).super__Tuple_impl<1UL,_int>.
         super__Head_base<1UL,_int,_false>._M_head_impl ==
         (actual->super__Tuple_impl<0UL,_int,_int>).super__Tuple_impl<1UL,_int>.
         super__Head_base<1UL,_int,_false>._M_head_impl)) {
    AVar2 = AssertionSuccess();
    sVar1 = AVar2.message_.ptr_;
  }
  else {
    AVar2 = CmpHelperEQFailure<std::tuple<int,int>,std::tuple<int,int>>
                      (this,expected_expression,actual_expression,expected,actual);
    sVar1 = AVar2.message_.ptr_;
  }
  AVar2.message_.ptr_ = sVar1.ptr_;
  AVar2._0_8_ = this;
  return AVar2;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
GTEST_DISABLE_MSC_WARNINGS_PUSH_(4389 /* signed/unsigned mismatch */)
  if (expected == actual) {
    return AssertionSuccess();
  }
GTEST_DISABLE_MSC_WARNINGS_POP_()

  return CmpHelperEQFailure(expected_expression, actual_expression, expected,
                            actual);
}